

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

int __thiscall
cmake::Build(cmake *this,int jobs,string *dir,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *targets,string *config,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *nativeOptions,bool clean,bool verbose)

{
  byte bVar1;
  byte bVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *config_00;
  string *targets_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *bindir;
  uint jobs_00;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  pointer pcVar6;
  char *pcVar7;
  cmGlobalGenerator *pcVar8;
  duration<double,_std::ratio<1L,_1L>_> timeout;
  allocator<char> local_12c9;
  string local_12c8;
  allocator<char> local_12a1;
  string local_12a0;
  allocator<char> local_1279;
  string local_1278;
  char *local_1258;
  char *cachedVerbose;
  string local_1248;
  char *local_1228;
  char *cachedProjectName;
  string projName;
  string output;
  string local_11d8 [32];
  cmStateSnapshot local_11b8;
  undefined1 local_11a0 [8];
  cmMakefile mf_1;
  string local_9b0;
  char *local_990;
  char *cachedGeneratorPlatform;
  string local_980 [32];
  cmStateSnapshot local_960;
  undefined1 local_948 [8];
  cmMakefile mf;
  string local_158;
  char *local_138;
  char *cachedGeneratorInstance;
  string local_128;
  cmGlobalGenerator *local_108;
  cmGlobalGenerator *gen;
  string local_f8;
  char *local_d8;
  char *cachedGenerator;
  undefined1 local_c8 [8];
  string cachePath;
  string local_a0;
  allocator<char> local_69;
  string local_68;
  byte local_42;
  byte local_41;
  bool verbose_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_40;
  bool clean_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *nativeOptions_local;
  string *config_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *targets_local;
  string *dir_local;
  cmake *pcStack_18;
  int jobs_local;
  cmake *this_local;
  
  local_41 = clean;
  local_42 = verbose;
  pvStack_40 = nativeOptions;
  nativeOptions_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)config;
  config_local = (string *)targets;
  targets_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)dir;
  dir_local._4_4_ = jobs;
  pcStack_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"",&local_69);
  SetHomeDirectory(this,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"",(allocator<char> *)(cachePath.field_2._M_local_buf + 0xf));
  SetHomeOutputDirectory(this,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)(cachePath.field_2._M_local_buf + 0xf));
  bVar3 = cmsys::SystemTools::FileIsDirectory((string *)targets_local);
  if (!bVar3) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error: ");
    poVar5 = std::operator<<(poVar5,(string *)targets_local);
    std::operator<<(poVar5," is not a directory\n");
    return 1;
  }
  FindCacheFile((string *)local_c8,(string *)targets_local);
  bVar3 = LoadCache(this,(string *)local_c8);
  if (bVar3) {
    pcVar6 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"CMAKE_GENERATOR",(allocator<char> *)((long)&gen + 7));
    pcVar7 = cmState::GetCacheEntryValue(pcVar6,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&gen + 7));
    local_d8 = pcVar7;
    if (pcVar7 == (char *)0x0) {
      std::operator<<((ostream *)&std::cerr,"Error: could not find CMAKE_GENERATOR in Cache\n");
      this_local._4_4_ = 1;
      cachedGenerator._4_4_ = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_128,pcVar7,(allocator<char> *)((long)&cachedGeneratorInstance + 7)
                );
      pcVar8 = CreateGlobalGenerator(this,&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      std::allocator<char>::~allocator((allocator<char> *)((long)&cachedGeneratorInstance + 7));
      local_108 = pcVar8;
      if (pcVar8 == (cmGlobalGenerator *)0x0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Error: could create CMAKE_GENERATOR \"");
        poVar5 = std::operator<<(poVar5,local_d8);
        std::operator<<(poVar5,"\"\n");
        this_local._4_4_ = 1;
        cachedGenerator._4_4_ = 1;
      }
      else {
        SetGlobalGenerator(this,pcVar8);
        pcVar6 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_158,"CMAKE_GENERATOR_INSTANCE",
                   (allocator<char> *)&mf.field_0x7e7);
        pcVar7 = cmState::GetCacheEntryValue(pcVar6,&local_158);
        std::__cxx11::string::~string((string *)&local_158);
        std::allocator<char>::~allocator((allocator<char> *)&mf.field_0x7e7);
        pcVar8 = local_108;
        local_138 = pcVar7;
        if (pcVar7 != (char *)0x0) {
          GetCurrentSnapshot(&local_960,this);
          cmMakefile::cmMakefile((cmMakefile *)local_948,pcVar8,&local_960);
          pcVar8 = local_108;
          pcVar7 = local_138;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (local_980,pcVar7,(allocator<char> *)((long)&cachedGeneratorPlatform + 7));
          iVar4 = (*pcVar8->_vptr_cmGlobalGenerator[8])(pcVar8,local_980,local_948);
          std::__cxx11::string::~string(local_980);
          std::allocator<char>::~allocator((allocator<char> *)((long)&cachedGeneratorPlatform + 7));
          bVar3 = (((byte)iVar4 ^ 0xff) & 1) != 0;
          if (bVar3) {
            this_local._4_4_ = 1;
          }
          cachedGenerator._4_4_ = (uint)bVar3;
          cmMakefile::~cmMakefile((cmMakefile *)local_948);
          if (cachedGenerator._4_4_ != 0) goto LAB_001fc6e5;
        }
        pcVar6 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_9b0,"CMAKE_GENERATOR_PLATFORM",
                   (allocator<char> *)&mf_1.field_0x7e7);
        pcVar7 = cmState::GetCacheEntryValue(pcVar6,&local_9b0);
        std::__cxx11::string::~string((string *)&local_9b0);
        std::allocator<char>::~allocator((allocator<char> *)&mf_1.field_0x7e7);
        pcVar8 = local_108;
        local_990 = pcVar7;
        if (pcVar7 != (char *)0x0) {
          GetCurrentSnapshot(&local_11b8,this);
          cmMakefile::cmMakefile((cmMakefile *)local_11a0,pcVar8,&local_11b8);
          pcVar8 = local_108;
          pcVar7 = local_990;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (local_11d8,pcVar7,(allocator<char> *)(output.field_2._M_local_buf + 0xf));
          iVar4 = (*pcVar8->_vptr_cmGlobalGenerator[9])(pcVar8,local_11d8,local_11a0);
          std::__cxx11::string::~string(local_11d8);
          std::allocator<char>::~allocator((allocator<char> *)(output.field_2._M_local_buf + 0xf));
          bVar3 = (((byte)iVar4 ^ 0xff) & 1) != 0;
          if (bVar3) {
            this_local._4_4_ = 1;
          }
          cachedGenerator._4_4_ = (uint)bVar3;
          cmMakefile::~cmMakefile((cmMakefile *)local_11a0);
          if (cachedGenerator._4_4_ != 0) goto LAB_001fc6e5;
        }
        std::__cxx11::string::string((string *)(projName.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)&cachedProjectName);
        pcVar6 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1248,"CMAKE_PROJECT_NAME",
                   (allocator<char> *)((long)&cachedVerbose + 7));
        pcVar7 = cmState::GetCacheEntryValue(pcVar6,&local_1248);
        std::__cxx11::string::~string((string *)&local_1248);
        std::allocator<char>::~allocator((allocator<char> *)((long)&cachedVerbose + 7));
        local_1228 = pcVar7;
        if (pcVar7 == (char *)0x0) {
          std::operator<<((ostream *)&std::cerr,
                          "Error: could not find CMAKE_PROJECT_NAME in Cache\n");
          this_local._4_4_ = 1;
        }
        else {
          std::__cxx11::string::operator=((string *)&cachedProjectName,pcVar7);
          pcVar6 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State)
          ;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1278,"CMAKE_VERBOSE_MAKEFILE",&local_1279);
          pcVar7 = cmState::GetCacheEntryValue(pcVar6,&local_1278);
          std::__cxx11::string::~string((string *)&local_1278);
          std::allocator<char>::~allocator(&local_1279);
          local_1258 = pcVar7;
          bVar3 = cmSystemTools::IsOn(pcVar7);
          if (bVar3) {
            local_42 = 1;
          }
          (*local_108->_vptr_cmGlobalGenerator[0x12])(local_108,&std::cerr,(ulong)dir_local._4_4_);
          jobs_00 = dir_local._4_4_;
          pcVar8 = local_108;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_12a0,"",&local_12a1);
          bindir = targets_local;
          targets_00 = config_local;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_12c8,"",&local_12c9);
          config_00 = nativeOptions_local;
          bVar2 = local_41;
          bVar1 = local_42;
          timeout = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
          this_local._4_4_ =
               cmGlobalGenerator::Build
                         (pcVar8,jobs_00,&local_12a0,(string *)bindir,(string *)&cachedProjectName,
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)targets_00,(string *)((long)&projName.field_2 + 8),&local_12c8,
                          (string *)config_00,(bool)(bVar2 & 1),false,(bool)(bVar1 & 1),
                          (cmDuration)timeout.__r,OUTPUT_PASSTHROUGH,pvStack_40);
          std::__cxx11::string::~string((string *)&local_12c8);
          std::allocator<char>::~allocator(&local_12c9);
          std::__cxx11::string::~string((string *)&local_12a0);
          std::allocator<char>::~allocator(&local_12a1);
        }
        cachedGenerator._4_4_ = 1;
        std::__cxx11::string::~string((string *)&cachedProjectName);
        std::__cxx11::string::~string((string *)(projName.field_2._M_local_buf + 8));
      }
    }
  }
  else {
    std::operator<<((ostream *)&std::cerr,"Error: could not load cache\n");
    this_local._4_4_ = 1;
    cachedGenerator._4_4_ = 1;
  }
LAB_001fc6e5:
  std::__cxx11::string::~string((string *)local_c8);
  return this_local._4_4_;
}

Assistant:

int cmake::Build(int jobs, const std::string& dir,
                 const std::vector<std::string>& targets,
                 const std::string& config,
                 const std::vector<std::string>& nativeOptions, bool clean,
                 bool verbose)
{

  this->SetHomeDirectory("");
  this->SetHomeOutputDirectory("");
  if (!cmSystemTools::FileIsDirectory(dir)) {
    std::cerr << "Error: " << dir << " is not a directory\n";
    return 1;
  }

  std::string cachePath = FindCacheFile(dir);
  if (!this->LoadCache(cachePath)) {
    std::cerr << "Error: could not load cache\n";
    return 1;
  }
  const char* cachedGenerator =
    this->State->GetCacheEntryValue("CMAKE_GENERATOR");
  if (!cachedGenerator) {
    std::cerr << "Error: could not find CMAKE_GENERATOR in Cache\n";
    return 1;
  }
  cmGlobalGenerator* gen = this->CreateGlobalGenerator(cachedGenerator);
  if (!gen) {
    std::cerr << "Error: could create CMAKE_GENERATOR \"" << cachedGenerator
              << "\"\n";
    return 1;
  }
  this->SetGlobalGenerator(gen);
  const char* cachedGeneratorInstance =
    this->State->GetCacheEntryValue("CMAKE_GENERATOR_INSTANCE");
  if (cachedGeneratorInstance) {
    cmMakefile mf(gen, this->GetCurrentSnapshot());
    if (!gen->SetGeneratorInstance(cachedGeneratorInstance, &mf)) {
      return 1;
    }
  }
  const char* cachedGeneratorPlatform =
    this->State->GetCacheEntryValue("CMAKE_GENERATOR_PLATFORM");
  if (cachedGeneratorPlatform) {
    cmMakefile mf(gen, this->GetCurrentSnapshot());
    if (!gen->SetGeneratorPlatform(cachedGeneratorPlatform, &mf)) {
      return 1;
    }
  }
  std::string output;
  std::string projName;
  const char* cachedProjectName =
    this->State->GetCacheEntryValue("CMAKE_PROJECT_NAME");
  if (!cachedProjectName) {
    std::cerr << "Error: could not find CMAKE_PROJECT_NAME in Cache\n";
    return 1;
  }
  projName = cachedProjectName;

  const char* cachedVerbose =
    this->State->GetCacheEntryValue("CMAKE_VERBOSE_MAKEFILE");
  if (cmSystemTools::IsOn(cachedVerbose)) {
    verbose = true;
  }

#ifdef CMAKE_HAVE_VS_GENERATORS
  // For VS generators, explicitly check if regeneration is necessary before
  // actually starting the build. If not done separately from the build
  // itself, there is the risk of building an out-of-date solution file due
  // to limitations of the underlying build system.
  std::string const stampList = cachePath + "/" + "CMakeFiles/" +
    cmGlobalVisualStudio9Generator::GetGenerateStampList();

  // Note that the stampList file only exists for VS generators.
  if (cmSystemTools::FileExists(stampList)) {

    // Check if running for Visual Studio 9 - we need to explicitly run
    // the glob verification script before starting the build
    this->AddScriptingCommands();
    if (this->GlobalGenerator->MatchesGeneratorName("Visual Studio 9 2008")) {
      std::string const globVerifyScript =
        cachePath + "/" + "CMakeFiles/" + "VerifyGlobs.cmake";
      if (cmSystemTools::FileExists(globVerifyScript)) {
        std::vector<std::string> args;
        this->ReadListFile(args, globVerifyScript);
      }
    }

    if (!cmakeCheckStampList(stampList)) {
      // Correctly initialize the home (=source) and home output (=binary)
      // directories, which is required for running the generation step.
      std::string homeOrig = this->GetHomeDirectory();
      std::string homeOutputOrig = this->GetHomeOutputDirectory();
      this->SetDirectoriesFromFile(cachePath);

      this->AddProjectCommands();

      int ret = this->Configure();
      if (ret) {
        cmSystemTools::Message("CMake Configure step failed.  "
                               "Build files cannot be regenerated correctly.");
        return ret;
      }
      ret = this->Generate();
      if (ret) {
        cmSystemTools::Message("CMake Generate step failed.  "
                               "Build files cannot be regenerated correctly.");
        return ret;
      }
      std::string message = "Build files have been written to: ";
      message += this->GetHomeOutputDirectory();
      this->UpdateProgress(message, -1);

      // Restore the previously set directories to their original value.
      this->SetHomeDirectory(homeOrig);
      this->SetHomeOutputDirectory(homeOutputOrig);
    }
  }
#endif

  gen->PrintBuildCommandAdvice(std::cerr, jobs);
  return gen->Build(jobs, "", dir, projName, targets, output, "", config,
                    clean, false, verbose, cmDuration::zero(),
                    cmSystemTools::OUTPUT_PASSTHROUGH, nativeOptions);
}